

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

bool duckdb_yyjson::is_truncated_end
               (u8 *hdr,u8 *cur,u8 *end,yyjson_read_code code,yyjson_read_flag flg)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  u8 *puVar4;
  ulong uVar5;
  byte *pbVar6;
  bool bVar7;
  
  if (end <= cur) {
    return true;
  }
  if ((code != 6) && (code != 9)) {
    if (code != 0xb) goto LAB_01f5db75;
    if ((end < cur + 4) && (iVar1 = bcmp(cur,"true",(long)end - (long)cur), iVar1 == 0)) {
      return true;
    }
    if ((end < cur + 5) && (iVar1 = bcmp(cur,"false",(long)end - (long)cur), iVar1 == 0)) {
      return true;
    }
    if ((end < cur + 4) && (iVar1 = bcmp(cur,"null",(long)end - (long)cur), iVar1 == 0)) {
      return true;
    }
  }
  if ((flg & 0x10) != 0) {
    puVar4 = cur + (ulong)(*cur == '-') + 8;
    cur = cur + (*cur == '-');
    if (cur < end && end < puVar4) {
      lVar3 = 0;
      while( true ) {
        if (end <= cur + lVar3) {
          return true;
        }
        bVar2 = cur[lVar3];
        if ((bVar2 != "Bar width must not be NaN or infinity"[lVar3 + 0x1d]) &&
           ((byte)"Bar width must not be NaN or infinity"[lVar3 + 0x1d] - 0x20 != (uint)bVar2))
        break;
        lVar3 = lVar3 + 1;
      }
    }
    if (end < cur + 3 && cur < end) {
      lVar3 = 0;
      while( true ) {
        if (end <= cur + lVar3) {
          return true;
        }
        bVar2 = cur[lVar3];
        if ((bVar2 != "has_nan"[lVar3 + 4]) && ((byte)"has_nan"[lVar3 + 4] - 0x20 != (uint)bVar2))
        break;
        lVar3 = lVar3 + 1;
      }
    }
  }
LAB_01f5db75:
  if (code == 10) {
    uVar5 = (long)end - (long)cur;
    bVar2 = *cur;
    if (bVar2 == 0x5c) {
      if (uVar5 == 1) {
        return true;
      }
      if ((uVar5 < 6) && (cur[1] == 0x75)) {
        pbVar6 = cur + 2;
        do {
          bVar7 = end <= pbVar6;
          if (bVar7) {
            return bVar7;
          }
          bVar2 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        } while ((char)char_table[bVar2] < '\0');
        return bVar7;
      }
    }
    else if ((char)bVar2 < '\0') {
      if (uVar5 == 3) {
        if ((bVar2 & 0xf8) == 0xf0) {
          return false;
        }
      }
      else if (uVar5 == 2) {
        if ((cur[1] & 0xc0) == 0x80 && (bVar2 & 0xf0) == 0xe0) {
          bVar2 = cur[1] >> 5 & 1 | bVar2 * '\x02' & 0x1e;
          return bVar2 != 0x1b && bVar2 != 0;
        }
      }
      else if (uVar5 == 1) {
        if ((bVar2 & 0xf0) == 0xe0) {
          return true;
        }
        if ((bVar2 & 0xe0) == 0xc0 && (bVar2 & 0x1e) != 0) {
          return true;
        }
        return (bVar2 & 7) < 5 && (bVar2 & 0xf8) == 0xf0;
      }
    }
  }
  else if ((((code == 4) && ((flg & 0x10) != 0)) && (hdr + 3 <= cur)) &&
          (pbVar6 = cur + -3, pbVar6 < end && end < cur + 5)) {
    lVar3 = 0;
    while( true ) {
      bVar7 = end <= pbVar6 + lVar3;
      if (bVar7) {
        return bVar7;
      }
      bVar2 = pbVar6[lVar3];
      if ((bVar2 != "Bar width must not be NaN or infinity"[lVar3 + 0x1d]) &&
         ((byte)"Bar width must not be NaN or infinity"[lVar3 + 0x1d] - 0x20 != (uint)bVar2)) break;
      lVar3 = lVar3 + 1;
    }
    return bVar7;
  }
  return false;
}

Assistant:

static_noinline bool is_truncated_end(u8 *hdr, u8 *cur, u8 *end,
                                      yyjson_read_code code,
                                      yyjson_read_flag flg) {
    if (cur >= end) return true;
    if (code == YYJSON_READ_ERROR_LITERAL) {
        if (is_truncated_str(cur, end, "true", true) ||
            is_truncated_str(cur, end, "false", true) ||
            is_truncated_str(cur, end, "null", true)) {
            return true;
        }
    }
    if (code == YYJSON_READ_ERROR_UNEXPECTED_CHARACTER ||
        code == YYJSON_READ_ERROR_INVALID_NUMBER ||
        code == YYJSON_READ_ERROR_LITERAL) {
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (*cur == '-') cur++;
            if (is_truncated_str(cur, end, "infinity", false) ||
                is_truncated_str(cur, end, "nan", false)) {
                return true;
            }
        }
    }
    if (code == YYJSON_READ_ERROR_UNEXPECTED_CONTENT) {
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (hdr + 3 <= cur &&
                is_truncated_str(cur - 3, end, "infinity", false)) {
                return true; /* e.g. infin would be read as inf + in */
            }
        }
    }
    if (code == YYJSON_READ_ERROR_INVALID_STRING) {
        usize len = (usize)(end - cur);

        /* unicode escape sequence */
        if (*cur == '\\') {
            if (len == 1) return true;
            if (len <= 5) {
                if (*++cur != 'u') return false;
                for (++cur; cur < end; cur++) {
                    if (!char_is_hex(*cur)) return false;
                }
                return true;
            }
            return false;
        }

        /* 2 to 4 bytes UTF-8, see `read_string()` for details. */
        if (*cur & 0x80) {
            u8 c0 = cur[0], c1 = cur[1], c2 = cur[2];
            if (len == 1) {
                /* 2 bytes UTF-8, truncated */
                if ((c0 & 0xE0) == 0xC0 && (c0 & 0x1E) != 0x00) return true;
                /* 3 bytes UTF-8, truncated */
                if ((c0 & 0xF0) == 0xE0) return true;
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 && (c0 & 0x07) <= 0x04) return true;
            }
            if (len == 2) {
                /* 3 bytes UTF-8, truncated */
                if ((c0 & 0xF0) == 0xE0 &&
                    (c1 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x0F) << 1) | ((c1 & 0x20) >> 5));
                    return 0x01 <= pat && pat != 0x1B;
                }
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 &&
                    (c1 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x07) << 2) | ((c1 & 0x30) >> 4));
                    return 0x01 <= pat && pat <= 0x10;
                }
            }
            if (len == 3) {
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 &&
                    (c1 & 0xC0) == 0x80 &&
                    (c2 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x07) << 2) | ((c1 & 0x30) >> 4));
                    return 0x01 <= pat && pat <= 0x10;
                }
            }
        }
    }
    return false;
}